

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_stdout_to_file(void)

{
  uv_stdio_flags uVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  undefined1 auVar4 [16];
  undefined8 local_1f8;
  uv_buf_t buf;
  uv_stdio_container_t stdio [2];
  uv_fs_t fs_req;
  uv_file file;
  int r;
  
  unlink("stdout_file");
  init_process_options("spawn_helper2",exit_cb);
  uVar1 = uv_fs_open(0,&stdio[1].data,"stdout_file",0x42,0x180);
  if (uVar1 == ~UV_IGNORE) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x147,"r != -1");
    abort();
  }
  uv_fs_req_cleanup(&stdio[1].data);
  options.stdio = (uv_stdio_container_t *)&buf.len;
  buf.len._0_4_ = 0;
  stdio[0].data.fd = 2;
  options.stdio_count = 2;
  stdio[1].flags = uVar1;
  uVar3 = uv_default_loop();
  iVar2 = uv_spawn(uVar3,&process,&options);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x153,"r == 0");
    abort();
  }
  uVar3 = uv_default_loop();
  iVar2 = uv_run(uVar3,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x156,"r == 0");
    abort();
  }
  if (exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x158,"exit_cb_called == 1");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x159,"close_cb_called == 1");
    abort();
  }
  auVar4 = uv_buf_init(output,0x400);
  buf.base = auVar4._8_8_;
  local_1f8 = auVar4._0_8_;
  iVar2 = uv_fs_read(0,&stdio[1].data,uVar1,&local_1f8,1,0,0);
  if (iVar2 != 0xc) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x15d,"r == 12");
    abort();
  }
  uv_fs_req_cleanup(&stdio[1].data);
  iVar2 = uv_fs_close(0,&stdio[1].data,uVar1);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x161,"r == 0");
    abort();
  }
  uv_fs_req_cleanup(&stdio[1].data);
  printf("output is: %s",output);
  iVar2 = strcmp("hello world\n",output);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x165,"strcmp(\"hello world\\n\", output) == 0");
    abort();
  }
  unlink("stdout_file");
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar2 = uv_loop_close(uVar3);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x16a,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_stdout_to_file) {
  int r;
  uv_file file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[2];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper2", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);

  file = r;

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = file;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT(r == 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strcmp("hello world\n", output) == 0);

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}